

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.h
# Opt level: O2

void __thiscall
xemmai::t_define<xemmai::t_global>::f_derive<xemmai::t_lexer::t_error,xemmai::t_throwable>
          (t_define<xemmai::t_global> *this)

{
  t_global *ptVar1;
  t_object *a_value;
  
  ptVar1 = this->v_library;
  a_value = t_type_of<xemmai::t_object>::f_derive<xemmai::t_type_of<xemmai::t_lexer::t_error>>
                      ((ptVar1->v_type_throwable).v_p,(t_object *)&ptVar1[-1].v_symbol_greater,
                       &this->v_fields);
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::f_construct(&ptVar1->v_type_lexer__error,a_value)
  ;
  return;
}

Assistant:

void f_derive()
	{
		v_library->template f_type_slot<T>().f_construct(v_library->template f_type<T_super>()->template f_derive<t_type_of<T>>(t_object::f_of(v_library), v_fields));
	}